

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Allocator alloc)

{
  Bounds2i local_28;
  
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_28.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_28.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
  Array2D<double>::Array2D((Array2D<double> *)this,&local_28,alloc);
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_28.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_28.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_28.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
  Array2D<float>::Array2D(&this->func,&local_28,alloc);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Allocator alloc) : sat(alloc), func(alloc) {}